

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O3

border_theme * border_theme_create(void)

{
  border_theme *pbVar1;
  
  pbVar1 = (border_theme *)malloc(8);
  if (pbVar1 != (border_theme *)0x0) {
    pbVar1->unfocused = 1;
    pbVar1->focused = 1;
    pbVar1->urgent = 1;
    pbVar1->sticky = 1;
  }
  return pbVar1;
}

Assistant:

struct border_theme *border_theme_create(void)
{
        struct border_theme *theme = malloc(sizeof(struct border_theme));

        if (theme == NULL) {
                return NULL;
        }

        theme->unfocused = DEFAULT_BORDER_WIDTH;
        theme->focused = DEFAULT_BORDER_WIDTH;
        theme->urgent = DEFAULT_BORDER_WIDTH;
        theme->sticky = DEFAULT_BORDER_WIDTH;

        return theme;
}